

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O1

armci_hdl_t * get_armci_nbhandle(Integer *nbhandle)

{
  struct_armcihdl_t *nb_handle;
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ga_armcihdl_t *pgVar5;
  int iVar6;
  struct_armcihdl_t *psVar7;
  
  bVar1 = (byte)*nbhandle;
  uVar4 = (long)(lastARMCIhandle + 1) % (long)nb_max_outstanding;
  lastARMCIhandle = (int)uVar4;
  iVar6 = lastARMCIhandle;
  if (0 < nb_max_outstanding) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      iVar6 = (int)uVar4 % nb_max_outstanding;
      if (armci_ihdl_array[iVar6].active == 0) break;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      iVar6 = lastARMCIhandle;
    } while ((int)uVar3 < lastARMCIhandle + nb_max_outstanding);
  }
  nb_handle = armci_ihdl_array + iVar6;
  if (armci_ihdl_array[iVar6].active != 1) goto LAB_0019ba3d;
  iVar2 = armci_ihdl_array[iVar6].ga_hdlarr_index;
  ARMCI_Wait(&nb_handle->handle);
  pgVar5 = armci_ihdl_array[iVar6].next;
  psVar7 = armci_ihdl_array[iVar6].previous;
  if (psVar7 == (struct_armcihdl_t *)0x0) {
    ga_ihdl_array[iVar2].ahandle = pgVar5;
    if (pgVar5 != (ga_armcihdl_t *)0x0) {
      psVar7 = (struct_armcihdl_t *)0x0;
      goto LAB_0019ba34;
    }
  }
  else {
    psVar7->next = pgVar5;
    pgVar5 = armci_ihdl_array[iVar6].next;
    if (pgVar5 != (ga_armcihdl_t *)0x0) {
LAB_0019ba34:
      pgVar5->previous = psVar7;
    }
  }
  ga_ihdl_array[iVar2].count = ga_ihdl_array[iVar2].count + -1;
LAB_0019ba3d:
  armci_ihdl_array[iVar6].active = 1;
  armci_ihdl_array[iVar6].previous = (struct_armcihdl_t *)0x0;
  pgVar5 = ga_ihdl_array[bVar1].ahandle;
  if (pgVar5 != (ga_armcihdl_t *)0x0) {
    pgVar5->previous = nb_handle;
  }
  ga_ihdl_array[bVar1].ahandle = nb_handle;
  ga_ihdl_array[bVar1].count = ga_ihdl_array[bVar1].count + 1;
  armci_ihdl_array[iVar6].next = pgVar5;
  armci_ihdl_array[iVar6].ga_hdlarr_index = (uint)bVar1;
  lastARMCIhandle = iVar6;
  return &nb_handle->handle;
}

Assistant:

armci_hdl_t* get_armci_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;

  lastARMCIhandle++;
  lastARMCIhandle = lastARMCIhandle%nb_max_outstanding;
  top = lastARMCIhandle+nb_max_outstanding;
  /* default index if no handles are available */
  iloc = lastARMCIhandle;
  for (i=lastARMCIhandle; i<top; i++) {
    idx = i%nb_max_outstanding;
    if (armci_ihdl_array[idx].active == 0) {
      iloc = idx;
      break;
    }
  }
  /* if selected handle represents an outstanding request, complete it */
  if (armci_ihdl_array[iloc].active == 1) {
    int iga_hdl = armci_ihdl_array[iloc].ga_hdlarr_index;
    ARMCI_Wait(&armci_ihdl_array[iloc].handle);
    /* clean up linked list that this handle used to be a link in */
    if (armci_ihdl_array[iloc].previous != NULL) {
      /* link is not first in linked list */
      armci_ihdl_array[iloc].previous->next = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = armci_ihdl_array[iloc].previous;
      }
    } else {
      /* link is first in linked list. Need to update header */
      ga_ihdl_array[iga_hdl].ahandle = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = NULL;
      }
    }
    ga_ihdl_array[iga_hdl].count--;
  }
  /* Initialize armci handle and add this operation to the linked list
   * corresponding to nbhandle */
  ARMCI_INIT_HANDLE(&armci_ihdl_array[iloc].handle);
  armci_ihdl_array[iloc].active = 1;
  armci_ihdl_array[iloc].previous = NULL;
  if (ga_ihdl_array[index].ahandle) {
    ga_ihdl_array[index].ahandle->previous = &armci_ihdl_array[iloc];
  }
  armci_ihdl_array[iloc].next = ga_ihdl_array[index].ahandle;
  ga_ihdl_array[index].ahandle =  &armci_ihdl_array[iloc];
  armci_ihdl_array[iloc].ga_hdlarr_index = index;
  ga_ihdl_array[index].count++;

  /* reset lastARMCIhandle to iloc */
  lastARMCIhandle = iloc;

  return &armci_ihdl_array[iloc].handle;
}